

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cute_runner.h
# Opt level: O1

bool __thiscall
cute::runner<cute::ide_listener<cute::null_listener>_>::runit
          (runner<cute::ide_listener<cute::null_listener>_> *this,test *t)

{
  ide_listener<cute::null_listener> *this_00;
  long lVar1;
  test_failure *e;
  long *plVar2;
  undefined8 *puVar3;
  int iVar4;
  bool bVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  string local_48;
  
  ide_listener<cute::null_listener>::start(this->listener,t);
  if ((t->theTest).super__Function_base._M_manager == (_Manager_type)0x0) {
    auVar6 = std::__throw_bad_function_call();
    iVar4 = auVar6._8_4_;
    lVar1 = auVar6._0_8_;
    if (iVar4 == 5) {
      e = (test_failure *)__cxa_begin_catch(lVar1);
      ide_listener<cute::null_listener>::failure(this->listener,t,e);
    }
    else if (iVar4 == 4) {
      plVar2 = (long *)__cxa_begin_catch(lVar1);
      this_00 = this->listener;
      auVar7 = (**(code **)(*plVar2 + 0x10))(plVar2);
      demangle_abi_cxx11_(&local_48,auVar7._0_8_,auVar7._8_8_);
      ide_listener<cute::null_listener>::error(this_00,t,local_48._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    else if (iVar4 == 3) {
      puVar3 = (undefined8 *)__cxa_begin_catch(lVar1);
      ide_listener<cute::null_listener>::error(this->listener,t,(char *)*puVar3);
    }
    else {
      __cxa_begin_catch(lVar1);
      if (iVar4 == 2) {
        ide_listener<cute::null_listener>::error(this->listener,t,*(char **)(lVar1 + 0x20));
      }
      else {
        ide_listener<cute::null_listener>::error(this->listener,t,"unknown exception thrown");
      }
    }
    __cxa_end_catch();
    bVar5 = false;
  }
  else {
    (*(t->theTest)._M_invoker)((_Any_data *)&t->theTest);
    bVar5 = true;
    ide_listener<cute::null_listener>::success(this->listener,t,"OK");
  }
  return bVar5;
}

Assistant:

bool runit(const test & t) const
	    {
	        try {
	            listener.start(t);
	            t();
	            listener.success(t, "OK");
	            return true;
	        } catch(const cute::test_failure & e){
	            listener.failure(t, e);
	        } catch(const std::exception & exc){
	            listener.error(t, demangle(exc.what()).c_str());
	        } catch(std::string & s){
	            listener.error(t, s.c_str());
	        } catch(const char *&cs) {
				listener.error(t,cs);
			} catch(...) {
				listener.error(t,"unknown exception thrown");
			}
			return false;
		}